

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_fwrite(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  char *__ptr;
  size_t __n;
  Value local_e0;
  size_t local_d0;
  size_t written;
  FILE *local_b8;
  FILE *handle;
  FileHandleStorage *storage;
  Value local_a0;
  undefined1 local_90 [8];
  Value fileWrapper;
  undefined1 local_70 [24];
  String data;
  String local_40;
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_40,"self");
  MiniScript::Context::GetVar
            ((Context *)&stack0xffffffffffffffd0,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  MiniScript::String::String((String *)&fileWrapper.data,"data");
  MiniScript::Context::GetVar((Context *)local_70,(String *)partialResult,(char)&fileWrapper + 8);
  MiniScript::Value::ToString((Value *)(local_70 + 0x10),(Machine *)local_70);
  MiniScript::Value::~Value((Value *)local_70);
  MiniScript::String::~String((String *)&fileWrapper.data);
  MiniScript::Value::Value(&local_a0,&_handle);
  MiniScript::Value::Lookup((Value *)local_90,(Value *)&stack0xffffffffffffffd0);
  MiniScript::Value::~Value(&local_a0);
  bVar1 = MiniScript::Value::IsNull((Value *)local_90);
  if ((bVar1) || (local_90[0] != Handle)) {
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  else {
    handle = (FILE *)fileWrapper._0_8_;
    local_b8 = *(FILE **)(fileWrapper._0_8_ + 0x10);
    if (local_b8 == (FILE *)0x0) {
      MiniScript::Value::Value((Value *)&written,(Value *)MiniScript::Value::zero);
      MiniScript::IntrinsicResult::IntrinsicResult
                ((IntrinsicResult *)context,(Value *)&written,true);
      MiniScript::Value::~Value((Value *)&written);
    }
    else {
      __ptr = MiniScript::String::c_str((String *)(local_70 + 0x10));
      __n = MiniScript::String::sizeB((String *)(local_70 + 0x10));
      local_d0 = fwrite(__ptr,1,__n,local_b8);
      MiniScript::Value::Value(&local_e0,(double)(int)local_d0);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_e0,true);
      MiniScript::Value::~Value(&local_e0);
    }
  }
  storage._4_4_ = 1;
  MiniScript::Value::~Value((Value *)local_90);
  MiniScript::String::~String((String *)(local_70 + 0x10));
  MiniScript::Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fwrite(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	String data = context->GetVar("data").ToString();

	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);

	size_t written = fwrite(data.c_str(), 1, data.sizeB(), handle);
	return IntrinsicResult((int)written);
}